

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::TrackObjTypeSpecWriteGuards
          (BackwardPass *this,PropertySymOpnd *opnd,BasicBlock *block)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *pHVar3;
  JitArenaAllocator *pJVar4;
  PropertySym *pPVar5;
  BVSparse<Memory::JitArenaAllocator> *pBVar6;
  undefined4 *puVar7;
  StackSym *pSVar8;
  ObjWriteGuardBucket *this_00;
  BVSparse<Memory::JitArenaAllocator> *writeGuards_1;
  ObjWriteGuardBucket *bucket_1;
  SymID writeGuardSymId;
  PropertySym *propertySym;
  TrackAllocData local_58;
  BVSparse<Memory::JitArenaAllocator> *local_30;
  BVSparse<Memory::JitArenaAllocator> *writeGuards;
  ObjWriteGuardBucket *bucket;
  BasicBlock *block_local;
  PropertySymOpnd *opnd_local;
  BackwardPass *this_local;
  
  bucket = (ObjWriteGuardBucket *)block;
  block_local = (BasicBlock *)opnd;
  opnd_local = (PropertySymOpnd *)this;
  if (this->tag == BackwardPhase) {
    bVar2 = IR::PropertySymOpnd::IsMono(opnd);
    if ((bVar2) &&
       (bVar2 = IR::PropertySymOpnd::MayNeedWriteGuardProtection((PropertySymOpnd *)block_local),
       bVar2)) {
      if (bucket[0x10].writeGuards == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        pHVar3 = HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::New
                           (&this->tempAlloc->super_ArenaAllocator,8);
        bucket[0x10].writeGuards = (BVSparse<Memory::JitArenaAllocator> *)pHVar3;
      }
      pHVar3 = (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *)bucket[0x10].writeGuards;
      pSVar8 = IR::PropertySymOpnd::GetObjectSym((PropertySymOpnd *)block_local);
      writeGuards = (BVSparse<Memory::JitArenaAllocator> *)
                    HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::FindOrInsertNew
                              (pHVar3,(pSVar8->super_Sym).m_id);
      local_30 = ObjWriteGuardBucket::GetWriteGuards((ObjWriteGuardBucket *)writeGuards);
      if (local_30 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        pJVar4 = this->tempAlloc;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_58,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                   ,0x1657);
        pJVar4 = (JitArenaAllocator *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)pJVar4,&local_58);
        pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
                 new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
        BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar6,this->tempAlloc);
        local_30 = pBVar6;
        ObjWriteGuardBucket::SetWriteGuards((ObjWriteGuardBucket *)writeGuards,pBVar6);
      }
      pPVar5 = Sym::AsPropertySym((Sym *)block_local->loop);
      if (pPVar5->m_writeGuardSym == (PropertySym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x165c,"(propertySym->m_writeGuardSym != nullptr)",
                           "propertySym->m_writeGuardSym != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set(local_30,(pPVar5->m_writeGuardSym->super_Sym).m_id);
    }
    bVar2 = IsPrePass(this);
    if (((!bVar2) && (bVar2 = IR::PropertySymOpnd::IsMono((PropertySymOpnd *)block_local), bVar2))
       && (bVar2 = IR::PropertySymOpnd::IsTypeDead((PropertySymOpnd *)block_local), !bVar2)) {
      pBVar6 = IR::PropertySymOpnd::GetWriteGuards((PropertySymOpnd *)block_local);
      if (pBVar6 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1666,"(opnd->GetWriteGuards() == nullptr)",
                           "opnd->GetWriteGuards() == nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (bucket[0x10].writeGuards != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        pHVar3 = (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *)bucket[0x10].writeGuards;
        pSVar8 = IR::PropertySymOpnd::GetObjectSym((PropertySymOpnd *)block_local);
        this_00 = HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::Get
                            (pHVar3,(pSVar8->super_Sym).m_id);
        if (this_00 != (ObjWriteGuardBucket *)0x0) {
          pBVar6 = ObjWriteGuardBucket::GetWriteGuards(this_00);
          pBVar6 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pBVar6,this->func->m_alloc);
          BVSparse<Memory::JitArenaAllocator>::And(pBVar6,bucket[6].writeGuards);
          IR::PropertySymOpnd::SetWriteGuards((PropertySymOpnd *)block_local,pBVar6);
        }
      }
    }
  }
  else {
    bVar2 = IR::PropertySymOpnd::MayNeedWriteGuardProtection(opnd);
    if ((bVar2) &&
       (bVar2 = IR::PropertySymOpnd::IsWriteGuardChecked((PropertySymOpnd *)block_local), !bVar2)) {
      propertyId = IR::PropertySymOpnd::GetPropertyId((PropertySymOpnd *)block_local);
      bVar2 = MayPropertyBeWrittenTo(this,propertyId);
      if (!bVar2) {
        IR::PropertySymOpnd::SetWriteGuardChecked((PropertySymOpnd *)block_local,true);
      }
    }
    bVar2 = IsPrePass(this);
    if ((!bVar2) &&
       (bVar2 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck((PropertySymOpnd *)block_local), !bVar2))
    {
      IR::PropertySymOpnd::ClearWriteGuards((PropertySymOpnd *)block_local);
    }
  }
  return;
}

Assistant:

void
BackwardPass::TrackObjTypeSpecWriteGuards(IR::PropertySymOpnd *opnd, BasicBlock *block)
{
    // TODO (ObjTypeSpec): Move write guard tracking to the forward pass, by recording on the type value
    // which property IDs have been written since the last type check. This will result in more accurate
    // tracking in cases when object pointer copy prop kicks in.
    if (this->tag == Js::BackwardPhase)
    {
        // If this operation may need a write guard (load from proto or fixed field check) then add its
        // write guard symbol to the map for this object. If it remains live (hasn't been written to)
        // until the type check upstream, it will get recorded there so that the type check can be registered
        // for invalidation on this property used in this operation.

        // (ObjTypeSpec): Consider supporting polymorphic write guards as well. We can't currently distinguish between mono and
        // poly write guards, and a type check can only protect operations matching with respect to polymorphism (see
        // BackwardPass::TrackObjTypeSpecProperties for details), so for now we only target monomorphic operations.
        if (opnd->IsMono() && opnd->MayNeedWriteGuardProtection())
        {
            if (block->stackSymToWriteGuardsMap == nullptr)
            {
                block->stackSymToWriteGuardsMap = HashTable<ObjWriteGuardBucket>::New(this->tempAlloc, 8);
            }

            ObjWriteGuardBucket* bucket = block->stackSymToWriteGuardsMap->FindOrInsertNew(opnd->GetObjectSym()->m_id);

            BVSparse<JitArenaAllocator>* writeGuards = bucket->GetWriteGuards();
            if (writeGuards == nullptr)
            {
                // The bit vectors we push around the flow graph only need to live as long as this phase.
                writeGuards = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
                bucket->SetWriteGuards(writeGuards);
            }

            PropertySym *propertySym = opnd->m_sym->AsPropertySym();
            Assert(propertySym->m_writeGuardSym != nullptr);
            SymID writeGuardSymId = propertySym->m_writeGuardSym->m_id;
            writeGuards->Set(writeGuardSymId);
        }

        // Record any live (upward exposed) write guards on this operation, if this operation may end up with
        // a type check.  If we ultimately don't need a type check here, we will simply ignore the guards, because
        // an earlier type check will protect them.
        if (!IsPrePass() && opnd->IsMono() && !opnd->IsTypeDead())
        {
            Assert(opnd->GetWriteGuards() == nullptr);
            if (block->stackSymToWriteGuardsMap != nullptr)
            {
                ObjWriteGuardBucket* bucket = block->stackSymToWriteGuardsMap->Get(opnd->GetObjectSym()->m_id);
                if (bucket != nullptr)
                {
                    // Get all the write guards associated with this object sym and filter them down to those that
                    // are upward exposed. If we end up emitting a type check for this instruction, we will create
                    // a type property guard registered for all guarded proto properties and we will set the write
                    // guard syms live during forward pass, such that we can avoid unnecessary write guard type
                    // checks and bailouts on every proto property (as long as it hasn't been written to since the
                    // primary type check).
                    auto writeGuards = bucket->GetWriteGuards()->CopyNew(this->func->m_alloc);
                    writeGuards->And(block->upwardExposedFields);
                    opnd->SetWriteGuards(writeGuards);
                }
            }
        }
    }
    else
    {
        // If we know this property has never been written to in this function (either on this object or any
        // of its aliases) we don't need the local type check.
        if (opnd->MayNeedWriteGuardProtection() && !opnd->IsWriteGuardChecked() && !MayPropertyBeWrittenTo(opnd->GetPropertyId()))
        {
            opnd->SetWriteGuardChecked(true);
        }

        // If we don't need a primary type check here let's clear the write guards. The primary type check upstream will
        // register the type check for the corresponding properties.
        if (!IsPrePass() && !opnd->NeedsPrimaryTypeCheck())
        {
            opnd->ClearWriteGuards();
        }
    }
}